

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::reserve(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
          *this,size_t n)

{
  memory_resource *pmVar1;
  optional<std::pair<int,_int>_> *poVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  optional<std::pair<int,_int>_> *poVar4;
  
  if (this->nAlloc < n) {
    if (n * 0xc == 0) {
      poVar4 = (optional<std::pair<int,_int>_> *)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0xc,4);
      poVar4 = (optional<std::pair<int,_int>_> *)CONCAT44(extraout_var,iVar3);
    }
    if (this->nStored != 0) {
      lVar5 = 8;
      uVar6 = 0;
      do {
        poVar2 = this->ptr;
        (poVar4->optionalValue).__data[lVar5] = (poVar2->optionalValue).__data[lVar5];
        if (((poVar2->optionalValue).__data[lVar5] == '\x01') &&
           (*(undefined8 *)((long)poVar4 + lVar5 + -8) = *(undefined8 *)((long)poVar2 + lVar5 + -8),
           (poVar2->optionalValue).__data[lVar5] == '\x01')) {
          (poVar2->optionalValue).__data[lVar5] = '\0';
        }
        if ((this->ptr->optionalValue).__data[lVar5] == '\x01') {
          (this->ptr->optionalValue).__data[lVar5] = '\0';
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0xc;
      } while (uVar6 < this->nStored);
    }
    if (this->ptr != (optional<std::pair<int,_int>_> *)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0xc,4);
    }
    this->nAlloc = n;
    this->ptr = poVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }